

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mhitu.c
# Opt level: O3

void mswings(monst *mtmp,obj *otemp)

{
  uint uVar1;
  char *pcVar2;
  int iVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  
  if (flags.verbose == '\0') {
    return;
  }
  if (u.uprops[0x1e].intrinsic == 0) {
    if ((ublindf == (obj *)0x0) || (ublindf->otyp == 0xed)) {
      if (((youmonst.data)->mflags1 & 0x1000) == 0) goto LAB_001d3529;
      goto LAB_001d34f7;
    }
  }
  else {
LAB_001d34f7:
    if (ublindf == (obj *)0x0) {
      return;
    }
  }
  if (ublindf->oartifact != '\x1d') {
    return;
  }
LAB_001d3529:
  uVar1 = *(uint *)&mtmp->field_0x60;
  if ((((uVar1 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) || (u.uprops[0xc].extrinsic != 0)) {
    if ((uVar1 & 0x280) != 0) {
      return;
    }
  }
  else {
    if ((uVar1 & 0x280) != 0) {
      return;
    }
    if (((youmonst.data)->mflags1 & 0x1000000) == 0) {
      return;
    }
  }
  if ((u._1052_1_ & 0x20) != 0) {
    return;
  }
  pcVar4 = Monnam(mtmp);
  pcVar6 = "thrusts";
  if ((*(ushort *)&objects[otemp->otyp].field_0x11 & 4) == 0) {
    pcVar6 = "swings";
  }
  iVar3 = pronoun_gender(level,mtmp);
  pcVar2 = genders[iVar3].his;
  pcVar5 = singular(otemp,xname);
  pline("%s %s %s %s.",pcVar4,pcVar6,pcVar2,pcVar5);
  return;
}

Assistant:

static void mswings(struct monst *mtmp, struct obj *otemp)
{
	if (!flags.verbose || Blind || !mon_visible(mtmp))
		return;
	pline("%s %s %s %s.", Monnam(mtmp),
	      (objects[otemp->otyp].oc_dir & PIERCE) ? "thrusts" : "swings",
	      mhis(level, mtmp), singular(otemp, xname));
}